

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice_detection_impl.cc
# Opt level: O1

int __thiscall
webrtc::VoiceDetectionImpl::set_likelihood(VoiceDetectionImpl *this,Likelihood likelihood)

{
  string *result;
  ostream *poVar1;
  CritScope cs;
  int local_194;
  CritScope local_190;
  FatalMessage local_188;
  
  rtc::CritScope::CritScope(&local_190,this->crit_);
  this->likelihood_ = likelihood;
  if (this->enabled_ == true) {
    if (likelihood < 4) {
      local_194 = WebRtcVad_set_mode(((this->vad_)._M_t.
                                      super___uniq_ptr_impl<webrtc::VoiceDetectionImpl::Vad,_std::default_delete<webrtc::VoiceDetectionImpl::Vad>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_webrtc::VoiceDetectionImpl::Vad_*,_std::default_delete<webrtc::VoiceDetectionImpl::Vad>_>
                                      .
                                      super__Head_base<0UL,_webrtc::VoiceDetectionImpl::Vad_*,_false>
                                     ._M_head_impl)->state_,3 - likelihood);
      local_188.stream_ = (ostringstream)0x0;
      local_188._1_3_ = 0;
      if (local_194 == 0) {
        result = (string *)0x0;
      }
      else {
        result = rtc::MakeCheckOpString<int,int>((int *)&local_188,&local_194,"0 == error");
      }
      if (result == (string *)0x0) goto LAB_0018c962;
      rtc::FatalMessage::FatalMessage
                (&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/voice_detection_impl.cc"
                 ,0x84,result);
    }
    else {
      rtc::FatalMessage::FatalMessage
                (&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/voice_detection_impl.cc"
                 ,0x80);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_188,"Check failed: false",0x13);
      poVar1 = std::endl<char,std::char_traits<char>>((ostream *)&local_188);
      std::operator<<(poVar1,"# ");
    }
    rtc::FatalMessage::~FatalMessage(&local_188);
  }
LAB_0018c962:
  rtc::CritScope::~CritScope(&local_190);
  return 0;
}

Assistant:

int VoiceDetectionImpl::set_likelihood(VoiceDetection::Likelihood likelihood) {
  rtc::CritScope cs(crit_);
  likelihood_ = likelihood;
  if (enabled_) {
    int mode = 2;
    switch (likelihood) {
      case VoiceDetection::kVeryLowLikelihood:
        mode = 3;
        break;
      case VoiceDetection::kLowLikelihood:
        mode = 2;
        break;
      case VoiceDetection::kModerateLikelihood:
        mode = 1;
        break;
      case VoiceDetection::kHighLikelihood:
        mode = 0;
        break;
      default:
        RTC_NOTREACHED();
        break;
    }
    int error = WebRtcVad_set_mode(vad_->state(), mode);
    RTC_DCHECK_EQ(0, error);
  }
  return AudioProcessing::kNoError;
}